

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

prevector<8U,_int,_unsigned_int,_int> * __thiscall
prevector<8U,_int,_unsigned_int,_int>::operator=
          (prevector<8U,_int,_unsigned_int,_int> *this,prevector<8U,_int,_unsigned_int,_int> *other)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_type sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined4 *in_RSI;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = is_direct(in_stack_ffffffffffffffd8);
  if (!bVar9) {
    free((in_RDI->_union).indirect_contents.indirect);
  }
  uVar2 = *in_RSI;
  uVar3 = in_RSI[1];
  sVar4 = in_RSI[2];
  uVar5 = in_RSI[3];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[6];
  uVar8 = in_RSI[7];
  *(undefined4 *)((long)&in_RDI->_union + 0x10) = in_RSI[4];
  *(undefined4 *)((long)&in_RDI->_union + 0x14) = uVar6;
  *(undefined4 *)((long)&in_RDI->_union + 0x18) = uVar7;
  *(undefined4 *)((long)&in_RDI->_union + 0x1c) = uVar8;
  *(undefined4 *)&in_RDI->_union = uVar2;
  *(undefined4 *)((long)&in_RDI->_union + 4) = uVar3;
  (in_RDI->_union).indirect_contents.capacity = sVar4;
  *(undefined4 *)((long)&in_RDI->_union + 0xc) = uVar5;
  in_RDI->_size = in_RSI[8];
  in_RSI[8] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

prevector& operator=(prevector<N, T, Size, Diff>&& other) noexcept {
        if (!is_direct()) {
            free(_union.indirect_contents.indirect);
        }
        _union = std::move(other._union);
        _size = other._size;
        other._size = 0;
        return *this;
    }